

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O3

void configDir(char **dir,uint *dirLength,char *application,uint applicationLength)

{
  uchar uVar1;
  char *source;
  uint length;
  char *home;
  uint homeLen;
  char *local_40;
  uint local_34;
  
  uVar1 = checkStringOutParameter(dir,dirLength);
  if (uVar1 != '\0') {
    getEnv("HOME",4,&local_40,&local_34);
    length = local_34 + applicationLength + 9;
    source = (char *)malloc((ulong)length);
    memcpy(source,local_40,(ulong)local_34);
    builtin_strncpy(source + local_34,"/.config/",9);
    free(local_40);
    memcpy(source + (local_34 + 9),application,(ulong)applicationLength);
    copyToStringOutParameter(source,length,dir,dirLength);
    free(source);
  }
  return;
}

Assistant:

void configDir(char ** dir, unsigned int * dirLength, const char * application, unsigned int applicationLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(dir, dirLength))
    {
        return;
    }

    char * configPath;
    unsigned int configPathLen;

    #if defined SYSTEM_WINDOWS
        char * appData;
        unsigned int appDataLen;
        getEnv("APPDATA", 7, &appData, &appDataLen);

        configPathLen = appDataLen + 1 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, appData, appDataLen);
        configPath[appDataLen] = '\\';

        free(appData);
    #elif defined SYSTEM_DARWIN
        char * home;
        unsigned int homeLen;
        getEnv("HOME", 4, &home, &homeLen);

        configPathLen = homeLen + 21 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, home, homeLen);
        memcpy(configPath + homeLen, "/Library/Preferences/", 21);

        free(home);
    #else
        char * home;
        unsigned int homeLen;
        getEnv("HOME", 4, &home, &homeLen);

        configPathLen = homeLen + 9 + applicationLength;
        configPath = (char *)malloc(sizeof(char) * configPathLen);
        memcpy(configPath, home, homeLen);
        memcpy(configPath + homeLen, "/.config/", 9);

        free(home);
    #endif

    unsigned int configPrefixLen = configPathLen - applicationLength;
    memcpy(configPath + configPrefixLen, application, applicationLength);
    copyToStringOutParameter(configPath, configPathLen, dir, dirLength);

    free(configPath);
}